

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O2

void stair_shuffle(dw_rom *rom)

{
  dw_map_index dVar1;
  dw_warp *pdVar2;
  dw_map_meta *pdVar3;
  dw_warp *pdVar4;
  byte bVar5;
  BOOL BVar6;
  dw_dungeon_tile dVar7;
  dungeon_map *pdVar8;
  dw_warp *pdVar9;
  dungeon_map *pdVar10;
  dungeon_map *pdVar11;
  uint8_t (*pauVar12) [30];
  size_t y_1;
  uint8_t *start;
  byte *pbVar13;
  byte bVar14;
  uint8_t (*pauVar15) [30];
  undefined8 uVar16;
  uint8_t (*pauVar17) [30];
  size_t j;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint8_t *puVar21;
  size_t y;
  ulong uVar22;
  long lVar23;
  
  pdVar8 = (dungeon_map *)calloc(0x11,0x387);
  uVar16 = 3;
  maps = pdVar8;
  pdVar9 = (dw_warp *)calloc(0x50,3);
  warps_to = pdVar9 + 0xf;
  pdVar2 = (rom->map).warps_from;
  lVar18 = 0;
  uVar19 = 0;
  warps_from = pdVar9;
  for (lVar23 = 0; lVar23 != 0x132; lVar23 = lVar23 + 3) {
    uVar20 = uVar19 - 0x33;
    if (uVar19 < 0x33) {
      uVar20 = uVar19;
    }
    BVar6 = indexes_contains((dw_map_index *)(ulong)pdVar2[uVar20].map,(dw_map_index)uVar16);
    if ((BVar6 != FALSE) &&
       (BVar6 = indexes_contains((dw_map_index *)(ulong)(rom->map).warps_to[uVar20].map,
                                 (dw_map_index)uVar16), BVar6 != FALSE)) {
      pdVar9[lVar18].y = (&pdVar2->y)[lVar23];
      *(undefined2 *)(pdVar9 + lVar18) = *(undefined2 *)(&pdVar2->map + lVar23);
      lVar18 = lVar18 + 1;
    }
    if (uVar19 == 0x33) {
      warps_to = pdVar9 + lVar18;
    }
    uVar19 = uVar19 + 1;
  }
  puVar21 = rom->content;
  pdVar3 = (rom->map).meta;
  pauVar12 = pdVar8->tiles + 1;
  for (uVar19 = 0; uVar19 != 0x10; uVar19 = uVar19 + 1) {
    dVar1 = indexes[uVar19];
    pdVar8[uVar19].index = (uint8_t)dVar1;
    bVar5 = pdVar3[dVar1].width + 1;
    pdVar8[uVar19].width = bVar5;
    bVar14 = pdVar3[dVar1].height + 1;
    uVar20 = (ulong)bVar14;
    pdVar8[uVar19].height = bVar14;
    pbVar13 = puVar21 + (*(ushort *)pdVar3[dVar1 & 0xff].pointer & 0x7fff);
    if (uVar19 < 2) {
      pauVar17 = pauVar12;
      for (uVar22 = 0; uVar22 < uVar20; uVar22 = uVar22 + 1) {
        pauVar15 = pauVar17;
        for (uVar20 = 0; uVar20 < bVar5; uVar20 = uVar20 + 2) {
          dVar7 = translate_town_tile((uint)(*pbVar13 >> 4));
          pauVar15[-1][0] = (uint8_t)dVar7;
          dVar7 = translate_town_tile(*pbVar13 & TOWN_TILE_COUNTER);
          (*pauVar15)[0] = (uint8_t)dVar7;
          pbVar13 = pbVar13 + 1;
          bVar5 = pdVar8[uVar19].width;
          pauVar15 = pauVar15 + 2;
        }
        uVar20 = (ulong)pdVar8[uVar19].height;
        pauVar17 = (uint8_t (*) [30])(*pauVar17 + 1);
      }
    }
    else {
      pauVar17 = pauVar12;
      for (uVar22 = 0; uVar22 < uVar20; uVar22 = uVar22 + 1) {
        pauVar15 = pauVar17;
        for (uVar20 = 0; uVar20 < bVar5; uVar20 = uVar20 + 2) {
          pauVar15[-1][0] = *pbVar13 >> 4 & 7;
          (*pauVar15)[0] = *pbVar13 & 7;
          pbVar13 = pbVar13 + 1;
          bVar5 = pdVar8[uVar19].width;
          pauVar15 = pauVar15 + 2;
        }
        uVar20 = (ulong)pdVar8[uVar19].height;
        pauVar17 = (uint8_t (*) [30])(*pauVar17 + 1);
      }
    }
    pauVar12 = (uint8_t (*) [30])((long)(pauVar12 + 0x1e) + 3);
  }
  rom->chest_access[0xf] = '\0';
  rom->chest_access[0x10] = '\0';
  rom->chest_access[0x11] = '\0';
  rom->chest_access[0x12] = '\0';
  rom->chest_access[0x13] = '\0';
  rom->chest_access[0x14] = '\0';
  rom->chest_access[0x15] = '\0';
  rom->chest_access[0x16] = '\0';
  rom->chest_access[0x17] = '\0';
  rom->chest_access[0x18] = '\0';
  rom->chest_access[0x19] = '\0';
  rom->chest_access[0x1a] = '\0';
  rom->chest_access[0x1b] = '\0';
  rom->chest_access[0x1c] = '\0';
  rom->chest_access[0x1d] = '\0';
  rom->chest_access[0x1e] = '\0';
  rom->chest_access[0] = '\0';
  rom->chest_access[1] = '\0';
  rom->chest_access[2] = '\0';
  rom->chest_access[3] = '\0';
  rom->chest_access[4] = '\0';
  rom->chest_access[5] = '\0';
  rom->chest_access[6] = '\0';
  rom->chest_access[7] = '\0';
  rom->chest_access[8] = '\0';
  rom->chest_access[9] = '\0';
  rom->chest_access[10] = '\0';
  rom->chest_access[0xb] = '\0';
  rom->chest_access[0xc] = '\0';
  rom->chest_access[0xd] = '\0';
  rom->chest_access[0xe] = '\0';
  rom->chest_access[0xf] = '\0';
  (rom->map).key_access = '\0';
  if ((rom->flags[2] & 0xc) != 0) {
    puts("Shuffling stairs...");
    pdVar8 = get_map(CHARLOCK);
    pdVar10 = get_map(CHARLOCK_THRONE_ROOM);
LAB_00155d75:
    do {
      clear_all_flags();
      mt_shuffle(warps_from,(((long)warps_to - (long)warps_from) / 3) * 2,3);
      pdVar11 = get_map(GARINS_GRAVE_1);
      map_dungeon(pdVar11,'\x06','\v',TRUE);
      pdVar11 = get_map(MOUNTAIN_CAVE);
      map_dungeon(pdVar11,'\x06','\x05',TRUE);
      pdVar11 = get_map(ERDRICKS_CAVE);
      map_dungeon(pdVar11,'\0','\0',TRUE);
      if ((rom->flags[7] & 3) == 0) {
        if (((pdVar8->tiles[10][0x13] | pdVar10->tiles[10][0x1d]) & 8) != 0) goto LAB_00155d75;
      }
      pdVar11 = get_map(CHARLOCK_THRONE_ROOM);
      map_dungeon(pdVar11,'\n','\x1d',TRUE);
      pauVar12 = maps->tiles;
      for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
        pauVar17 = pauVar12;
        for (uVar19 = 0; uVar19 != maps[lVar18].width; uVar19 = uVar19 + 1) {
          uVar20 = 0;
          while (maps[lVar18].width != uVar20) {
            puVar21 = *pauVar17 + uVar20;
            uVar20 = uVar20 + 1;
            if (*puVar21 == '\x04') goto LAB_00155d75;
          }
          pauVar17 = pauVar17 + 1;
        }
        pauVar12 = (uint8_t (*) [30])((long)(pauVar12 + 0x1e) + 3);
      }
      if ((rom->flags[7] & 3) != 0) break;
      clear_all_flags();
      map_dungeon(pdVar8,'\n','\x13',TRUE);
    } while ((pdVar10->tiles[10][0x1d] & 8) == 0);
    vpatch(rom,0xd95e,3,0x20,0xb5,0xda);
    vpatch(rom,0xd9be,9,0xf0,7,0xc9,3,0xf0,3,0x4c,0xc6,0xda);
    vpatch(rom,0xda06,0xb,0x4c,0x3d,0xd9,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
    uVar16 = 0xdaa5;
    vpatch(rom,0xdaa5,0x3e,0xc9,6,0xf0,4,0xc9,0xf,0x90,0xa8,0xae,0x2f,0x66,0xa9,2,0x4c,0xe2,0xd9,
           0xa5,0x45,0xc9,2,0xf0,7,0xc9,0xf,0xb0,3,0x8e,0x2f,0x66,0xbd,0x61,0xf4,0x60,0x20,0xf0,0xc6
           ,2,0x20,0xcb,199,0xd,0x4c,0xd9,0xcf,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,
           0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
    pdVar9 = warps_to;
    pdVar2 = warps_from;
    lVar23 = 0;
    for (lVar18 = 0; lVar18 != 0x99; lVar18 = lVar18 + 3) {
      pdVar4 = (rom->map).warps_from;
      BVar6 = indexes_contains((dw_map_index *)(ulong)(&pdVar4->map)[lVar18],(dw_map_index)uVar16);
      if ((BVar6 != FALSE) &&
         (BVar6 = indexes_contains((dw_map_index *)(ulong)(&((rom->map).warps_to)->map)[lVar18],
                                   (dw_map_index)uVar16), BVar6 != FALSE)) {
        puVar21 = &pdVar4->map + lVar18;
        puVar21[2] = pdVar2[lVar23].y;
        *(undefined2 *)puVar21 = *(undefined2 *)(pdVar2 + lVar23);
        pdVar4 = (rom->map).warps_to;
        (&pdVar4->y)[lVar18] = pdVar9[lVar23].y;
        *(undefined2 *)(&pdVar4->map + lVar18) = *(undefined2 *)(pdVar9 + lVar23);
        lVar23 = lVar23 + 1;
      }
    }
  }
  puts("Mapping Dungeons...");
  get_map(ERDRICKS_CAVE);
  clear_all_flags();
  pdVar8 = get_map(ERDRICKS_CAVE);
  map_dungeon(pdVar8,'\0','\0',FALSE);
  mark_chests(rom,'\x01');
  clear_all_flags();
  pdVar8 = get_map(ERDRICKS_CAVE);
  map_dungeon(pdVar8,'\0','\0',TRUE);
  mark_chests(rom,'\x10');
  clear_all_flags();
  pdVar8 = get_map(MOUNTAIN_CAVE);
  map_dungeon(pdVar8,'\x06','\x05',FALSE);
  mark_chests(rom,'\x02');
  clear_all_flags();
  pdVar8 = get_map(MOUNTAIN_CAVE);
  map_dungeon(pdVar8,'\x06','\x05',TRUE);
  mark_chests(rom,' ');
  clear_all_flags();
  pdVar8 = get_map(GARINS_GRAVE_1);
  map_dungeon(pdVar8,'\x06','\v',FALSE);
  mark_chests(rom,'\x04');
  clear_all_flags();
  pdVar8 = get_map(GARINS_GRAVE_1);
  map_dungeon(pdVar8,'\x06','\v',TRUE);
  mark_chests(rom,'@');
  clear_all_flags();
  pdVar8 = get_map(CHARLOCK_THRONE_ROOM);
  map_dungeon(pdVar8,'\n','\x13',FALSE);
  mark_chests(rom,'\b');
  clear_all_flags();
  pdVar8 = get_map(CHARLOCK_THRONE_ROOM);
  map_dungeon(pdVar8,'\n','\x13',TRUE);
  mark_chests(rom,0x80);
  return;
}

Assistant:

void stair_shuffle(dw_rom *rom)
{

    stair_shuffle_init(rom);
    if (STAIR_SHUFFLE(rom)) {
        printf("Shuffling stairs...\n");
        do_shuffle(rom);
        code_patches(rom);
        write_back_warps(rom);
    }
    chest_paths(rom);

}